

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O1

void copysymbol(MOJOSHADER_symbol *dst,MOJOSHADER_symbol *src,MOJOSHADER_malloc m,void *d)

{
  size_t sVar1;
  char *__dest;
  
  sVar1 = strlen(src->name);
  __dest = (char *)(*m)((int)sVar1 + 1,d);
  strcpy(__dest,src->name);
  dst->name = __dest;
  dst->register_set = src->register_set;
  dst->register_index = src->register_index;
  dst->register_count = src->register_count;
  copysymbolinfo(&dst->info,&src->info,m,d);
  return;
}

Assistant:

void copysymbol(MOJOSHADER_symbol *dst,
                MOJOSHADER_symbol *src,
                MOJOSHADER_malloc m,
                void *d)
{
    uint32 siz = strlen(src->name) + 1;
    char *stringcopy = (char *) m(siz, d);
    // !!! FIXME: Out of memory check!
    strcpy(stringcopy, src->name);
    dst->name = stringcopy;
    dst->register_set = src->register_set;
    dst->register_index = src->register_index;
    dst->register_count = src->register_count;
    copysymbolinfo(&dst->info, &src->info, m, d);
}